

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVJobServerClient.cxx
# Opt level: O0

void __thiscall cmUVJobServerClient::Impl::RequestImplicitToken(Impl *this)

{
  _func_void_uv_idle_t_ptr *cb;
  __0 local_11;
  Impl *local_10;
  Impl *this_local;
  
  local_10 = this;
  if (this->HeldTokens == 0) {
    cb = RequestImplicitToken()::$_0::operator_cast_to_function_pointer(&local_11);
    ::cm::uv_idle_ptr::start(&this->ImplicitToken,cb);
    return;
  }
  __assert_fail("this->HeldTokens == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmUVJobServerClient.cxx"
                ,0x74,"void cmUVJobServerClient::Impl::RequestImplicitToken()");
}

Assistant:

void cmUVJobServerClient::Impl::RequestImplicitToken()
{
  assert(this->HeldTokens == 0);
  this->ImplicitToken.start([](uv_idle_t* handle) {
    uv_idle_stop(handle);
    auto* self = static_cast<Impl*>(handle->data);
    self->HoldToken();
  });
}